

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>::walkFunctionInModule
          (Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_> *this,Function *func,
          Module *module)

{
  this->currModule = module;
  this->currFunction = func;
  walk(this,&func->body);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }